

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::AppendDirectoryCleanCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands)

{
  uint uVar1;
  cmMakefile *pcVar2;
  cmLocalGenerator *this_00;
  pointer pbVar3;
  char *pcVar4;
  string *psVar5;
  const_reference ppcVar6;
  string *in_base;
  ostream *poVar7;
  pointer in_path;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmGeneratorExpression ge;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cleanFiles;
  string cleanfile;
  cmListFileBacktrace local_268;
  string local_250;
  ofstream fout;
  
  cleanFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cleanFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cleanFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fout,"ADDITIONAL_CLEAN_FILES",(allocator<char> *)&cleanfile);
  pcVar4 = cmMakefile::GetProperty(pcVar2,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  if (pcVar4 != (char *)0x0) {
    local_268.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_268.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmGeneratorExpression::cmGeneratorExpression(&ge,&local_268);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_268.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(char *)&ge);
    pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fout,"CMAKE_BUILD_TYPE",(allocator<char> *)&local_250);
    psVar5 = cmMakefile::GetSafeDefinition(pcVar2,(string *)&fout);
    cleanfile._M_dataplus._M_p = (pointer)&cleanfile.field_2;
    cleanfile._M_string_length = 0;
    cleanfile.field_2._M_local_buf[0] = '\0';
    psVar5 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)
                        cge._M_t.
                        super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                        .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
                        (cmLocalGenerator *)this,psVar5,false,(cmGeneratorTarget *)0x0,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,&cleanfile);
    cmSystemTools::ExpandListArgument(psVar5,&cleanFiles,false);
    std::__cxx11::string::~string((string *)&cleanfile);
    std::__cxx11::string::~string((string *)&fout);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr(&cge);
    cmGeneratorExpression::~cmGeneratorExpression(&ge);
  }
  if (cleanFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      cleanFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppcVar6 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::at
                        (&((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                          GlobalGenerator)->LocalGenerators,0);
    this_00 = *ppcVar6;
    psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
    in_base = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    std::__cxx11::string::string((string *)&cleanfile,(string *)in_base);
    std::__cxx11::string::append((char *)&cleanfile);
    cmsys::SystemTools::CollapseFullPath((string *)&ge,&cleanfile);
    std::ofstream::ofstream
              (&fout,(char *)ge.Backtrace.TopEntry.
                             super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,_S_out);
    uVar1 = *(uint *)(&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20 +
                     (long)fout.super_basic_ostream<char,_std::char_traits<char>_>.
                           _vptr_basic_ostream[-3]);
    if ((uVar1 & 5) == 0) {
      std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,
                      "file(REMOVE_RECURSE\n");
      pbVar3 = cleanFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (in_path = cleanFiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; in_path != pbVar3;
          in_path = in_path + 1) {
        cmsys::SystemTools::CollapseFullPath(&local_250,in_path,in_base);
        cmLocalGenerator::MaybeConvertToRelativePath((string *)&cge,this_00,psVar5,&local_250);
        std::__cxx11::string::~string((string *)&local_250);
        poVar7 = std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,"  ");
        cmOutputConverter::EscapeForCMake(&local_250,(string *)&cge);
        poVar7 = std::operator<<(poVar7,(string *)&local_250);
        std::operator<<(poVar7,"\n");
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&cge);
      }
      std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,")\n");
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cge,
                     "Could not create ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ge);
      cmSystemTools::Error((string *)&cge);
      std::__cxx11::string::~string((string *)&cge);
    }
    std::ofstream::~ofstream(&fout);
    std::__cxx11::string::~string((string *)&ge);
    if ((uVar1 & 5) == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fout,"$(CMAKE_COMMAND) -P ",(allocator<char> *)&ge);
      cmLocalGenerator::MaybeConvertToRelativePath((string *)&cge,this_00,psVar5,&cleanfile);
      cmOutputConverter::ConvertToOutputFormat
                ((string *)&ge,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,(string *)&cge,SHELL);
      std::__cxx11::string::append((string *)&fout);
      std::__cxx11::string::~string((string *)&ge);
      std::__cxx11::string::~string((string *)&cge);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout);
      std::__cxx11::string::~string((string *)&fout);
    }
    std::__cxx11::string::~string((string *)&cleanfile);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&cleanFiles);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendDirectoryCleanCommand(
  std::vector<std::string>& commands)
{
  std::vector<std::string> cleanFiles;
  // Look for additional files registered for cleaning in this directory.
  if (const char* prop_value =
        this->Makefile->GetProperty("ADDITIONAL_CLEAN_FILES")) {
    cmGeneratorExpression ge;
    std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(prop_value);
    cmSystemTools::ExpandListArgument(
      cge->Evaluate(this,
                    this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE")),
      cleanFiles);
  }
  if (cleanFiles.empty()) {
    return;
  }

  cmLocalGenerator* rootLG =
    this->GetGlobalGenerator()->GetLocalGenerators().at(0);
  std::string const& binaryDir = rootLG->GetCurrentBinaryDirectory();
  std::string const& currentBinaryDir = this->GetCurrentBinaryDirectory();
  std::string cleanfile = currentBinaryDir;
  cleanfile += "/CMakeFiles/cmake_directory_clean.cmake";
  // Write clean script
  {
    std::string cleanfilePath = cmSystemTools::CollapseFullPath(cleanfile);
    cmsys::ofstream fout(cleanfilePath.c_str());
    if (!fout) {
      cmSystemTools::Error("Could not create " + cleanfilePath);
      return;
    }
    fout << "file(REMOVE_RECURSE\n";
    for (std::string const& cfl : cleanFiles) {
      std::string fc = rootLG->MaybeConvertToRelativePath(
        binaryDir, cmSystemTools::CollapseFullPath(cfl, currentBinaryDir));
      fout << "  " << cmOutputConverter::EscapeForCMake(fc) << "\n";
    }
    fout << ")\n";
  }
  // Create command
  {
    std::string remove = "$(CMAKE_COMMAND) -P ";
    remove += this->ConvertToOutputFormat(
      rootLG->MaybeConvertToRelativePath(binaryDir, cleanfile),
      cmOutputConverter::SHELL);
    commands.push_back(std::move(remove));
  }
}